

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase165::run(TestCase165 *this)

{
  __pid_t _Var1;
  __pid_t local_bc;
  int local_b8;
  bool local_b2;
  bool _kj_shouldLog;
  undefined1 *puStack_b0;
  undefined1 local_a8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:172:32),_int>
  promise3;
  undefined1 local_90 [8];
  Promise<int> promise2;
  undefined1 local_78 [8];
  Promise<int> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase165 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  evalLater<kj::(anonymous_namespace)::TestCase165::run()::__0>
            ((kj *)local_78,(Type *)((long)&promise2.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase165::run()::__1>
            ((kj *)local_90,(Type *)((long)&promise3.super_PromiseBase.node.ptr + 7));
  puStack_b0 = local_90;
  Promise<int>::then<kj::(anonymous_namespace)::TestCase165::run()::__2,kj::_::PropagateException>
            ((Promise<int> *)local_a8,(Type *)local_78,
             (PropagateException *)&stack0xffffffffffffff50);
  _Var1 = Promise<int>::wait((Promise<int> *)local_a8,local_58);
  if (_Var1 != 0x1bc) {
    local_b2 = _::Debug::shouldLog(ERROR);
    while (local_b2 != false) {
      local_b8 = 0x1bc;
      local_bc = Promise<int>::wait((Promise<int> *)local_a8,local_58);
      _::Debug::log<char_const(&)[53],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(444) == (promise3.wait(waitScope))\", 444, promise3.wait(waitScope)"
                 ,(char (*) [53])"failed: expected (444) == (promise3.wait(waitScope))",&local_b8,
                 &local_bc);
      local_b2 = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_a8);
  Promise<int>::~Promise((Promise<int> *)local_90);
  Promise<int>::~Promise((Promise<int> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, Chain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() -> int { return 123; });
  Promise<int> promise2 = evalLater([&]() -> int { return 321; });

  auto promise3 = promise.then([&](int i) {
    return promise2.then([i](int j) {
      return i + j;
    });
  });

  EXPECT_EQ(444, promise3.wait(waitScope));
}